

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O2

int nn_btcp_create(nn_ep *ep)

{
  int iVar1;
  int iVar2;
  nn_btcp *self;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  nn_ctx *ctx;
  undefined8 uVar6;
  nn_usock *self_00;
  nn_fsm_event *self_01;
  size_t sStack_170;
  int ipv4only;
  int ipv4only_1;
  nn_fsm_event *local_160;
  size_t local_158;
  size_t ipv4onlylen;
  size_t sslen;
  size_t local_140;
  sockaddr_storage local_138;
  sockaddr_storage ss;
  
  self = (nn_btcp *)nn_alloc_(0x308);
  self->ep = ep;
  nn_ep_tran_setup(ep,&nn_btcp_ep_ops,self);
  pcVar3 = nn_ep_getaddr(ep);
  pcVar4 = strrchr(pcVar3,0x3a);
  if (pcVar4 != (char *)0x0) {
    sVar5 = strlen(pcVar3);
    pcVar4 = pcVar4 + 1;
    iVar1 = nn_port_resolve(pcVar4,(size_t)(pcVar3 + (sVar5 - (long)pcVar4)));
    if (-1 < iVar1) {
      ipv4onlylen = 4;
      nn_ep_getopt(ep,0,0xe,&ipv4only,&ipv4onlylen);
      if (ipv4onlylen != 4) {
        nn_backtrace_print();
        pcVar3 = "ipv4onlylen == sizeof (ipv4only)";
        uVar6 = 0x8b;
LAB_0012edd1:
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
                ,uVar6);
        fflush(_stderr);
        nn_err_abort();
      }
      iVar1 = nn_iface_resolve(pcVar3,(size_t)(pcVar4 + ~(ulong)pcVar3),ipv4only,&ss,&sslen);
      if (iVar1 < 0) {
        nn_free(self);
        return -0x13;
      }
      ctx = nn_ep_getctx(ep);
      nn_fsm_init_root((nn_fsm *)self,nn_btcp_handler,nn_btcp_shutdown,ctx);
      self_01 = &self->listen_error;
      nn_fsm_event_init(self_01);
      self->state = 1;
      self->atcp = (nn_atcp *)0x0;
      nn_list_init(&self->atcps);
      nn_fsm_start((nn_fsm *)self);
      self_00 = &self->usock;
      nn_usock_init(self_00,1,(nn_fsm *)self);
      pcVar3 = nn_ep_getaddr(self->ep);
      local_138.ss_family = 0;
      local_138.__ss_padding[0] = '\0';
      local_138.__ss_padding[1] = '\0';
      local_138.__ss_padding[2] = '\0';
      local_138.__ss_padding[3] = '\0';
      local_138.__ss_padding[4] = '\0';
      local_138.__ss_padding[5] = '\0';
      local_138.__ss_padding[6] = '\0';
      local_138.__ss_padding[7] = '\0';
      local_138.__ss_padding[8] = '\0';
      local_138.__ss_padding[9] = '\0';
      local_138.__ss_padding[10] = '\0';
      local_138.__ss_padding[0xb] = '\0';
      local_138.__ss_padding[0xc] = '\0';
      local_138.__ss_padding[0xd] = '\0';
      local_138.__ss_padding[0xe] = '\0';
      local_138.__ss_padding[0xf] = '\0';
      local_138.__ss_padding[0x10] = '\0';
      local_138.__ss_padding[0x11] = '\0';
      local_138.__ss_padding[0x12] = '\0';
      local_138.__ss_padding[0x13] = '\0';
      local_138.__ss_padding[0x14] = '\0';
      local_138.__ss_padding[0x15] = '\0';
      local_138.__ss_padding[0x16] = '\0';
      local_138.__ss_padding[0x17] = '\0';
      local_138.__ss_padding[0x18] = '\0';
      local_138.__ss_padding[0x19] = '\0';
      local_138.__ss_padding[0x1a] = '\0';
      local_138.__ss_padding[0x1b] = '\0';
      local_138.__ss_padding[0x1c] = '\0';
      local_138.__ss_padding[0x1d] = '\0';
      local_138.__ss_padding[0x1e] = '\0';
      local_138.__ss_padding[0x1f] = '\0';
      local_138.__ss_padding[0x20] = '\0';
      local_138.__ss_padding[0x21] = '\0';
      local_138.__ss_padding[0x22] = '\0';
      local_138.__ss_padding[0x23] = '\0';
      local_138.__ss_padding[0x24] = '\0';
      local_138.__ss_padding[0x25] = '\0';
      local_138.__ss_padding[0x26] = '\0';
      local_138.__ss_padding[0x27] = '\0';
      local_138.__ss_padding[0x28] = '\0';
      local_138.__ss_padding[0x29] = '\0';
      local_138.__ss_padding[0x2a] = '\0';
      local_138.__ss_padding[0x2b] = '\0';
      local_138.__ss_padding[0x2c] = '\0';
      local_138.__ss_padding[0x2d] = '\0';
      local_138.__ss_padding[0x2e] = '\0';
      local_138.__ss_padding[0x2f] = '\0';
      local_138.__ss_padding[0x30] = '\0';
      local_138.__ss_padding[0x31] = '\0';
      local_138.__ss_padding[0x32] = '\0';
      local_138.__ss_padding[0x33] = '\0';
      local_138.__ss_padding[0x34] = '\0';
      local_138.__ss_padding[0x35] = '\0';
      local_138.__ss_padding[0x36] = '\0';
      local_138.__ss_padding[0x37] = '\0';
      local_138.__ss_padding[0x38] = '\0';
      local_138.__ss_padding[0x39] = '\0';
      local_138.__ss_padding[0x3a] = '\0';
      local_138.__ss_padding[0x3b] = '\0';
      local_138.__ss_padding[0x3c] = '\0';
      local_138.__ss_padding[0x3d] = '\0';
      local_138.__ss_padding[0x3e] = '\0';
      local_138.__ss_padding[0x3f] = '\0';
      local_138.__ss_padding[0x40] = '\0';
      local_138.__ss_padding[0x41] = '\0';
      local_138.__ss_padding[0x42] = '\0';
      local_138.__ss_padding[0x43] = '\0';
      local_138.__ss_padding[0x44] = '\0';
      local_138.__ss_padding[0x45] = '\0';
      local_138.__ss_padding[0x46] = '\0';
      local_138.__ss_padding[0x47] = '\0';
      local_138.__ss_padding[0x48] = '\0';
      local_138.__ss_padding[0x49] = '\0';
      local_138.__ss_padding[0x4a] = '\0';
      local_138.__ss_padding[0x4b] = '\0';
      local_138.__ss_padding[0x4c] = '\0';
      local_138.__ss_padding[0x4d] = '\0';
      local_138.__ss_padding[0x4e] = '\0';
      local_138.__ss_padding[0x4f] = '\0';
      local_138.__ss_padding[0x50] = '\0';
      local_138.__ss_padding[0x51] = '\0';
      local_138.__ss_padding[0x52] = '\0';
      local_138.__ss_padding[0x53] = '\0';
      local_138.__ss_padding[0x54] = '\0';
      local_138.__ss_padding[0x55] = '\0';
      local_138.__ss_padding[0x56] = '\0';
      local_138.__ss_padding[0x57] = '\0';
      local_138.__ss_padding[0x58] = '\0';
      local_138.__ss_padding[0x59] = '\0';
      local_138.__ss_padding[0x5a] = '\0';
      local_138.__ss_padding[0x5b] = '\0';
      local_138.__ss_padding[0x5c] = '\0';
      local_138.__ss_padding[0x5d] = '\0';
      local_138.__ss_padding[0x5e] = '\0';
      local_138.__ss_padding[0x5f] = '\0';
      local_138.__ss_padding[0x60] = '\0';
      local_138.__ss_padding[0x61] = '\0';
      local_138.__ss_padding[0x62] = '\0';
      local_138.__ss_padding[99] = '\0';
      local_138.__ss_padding[100] = '\0';
      local_138.__ss_padding[0x65] = '\0';
      local_138.__ss_padding[0x66] = '\0';
      local_138.__ss_padding[0x67] = '\0';
      local_138.__ss_padding[0x68] = '\0';
      local_138.__ss_padding[0x69] = '\0';
      local_138.__ss_padding[0x6a] = '\0';
      local_138.__ss_padding[0x6b] = '\0';
      local_138.__ss_padding[0x6c] = '\0';
      local_138.__ss_padding[0x6d] = '\0';
      local_138.__ss_padding[0x6e] = '\0';
      local_138.__ss_padding[0x6f] = '\0';
      local_138.__ss_padding[0x70] = '\0';
      local_138.__ss_padding[0x71] = '\0';
      local_138.__ss_padding[0x72] = '\0';
      local_138.__ss_padding[0x73] = '\0';
      local_138.__ss_padding[0x74] = '\0';
      local_138.__ss_padding[0x75] = '\0';
      local_138.__ss_align = 0;
      pcVar4 = strrchr(pcVar3,0x3a);
      if (pcVar4 == (char *)0x0) {
        iVar1 = -0x16;
      }
      else {
        sVar5 = strlen(pcVar3);
        pcVar4 = pcVar4 + 1;
        iVar2 = nn_port_resolve(pcVar4,(size_t)(pcVar3 + (sVar5 - (long)pcVar4)));
        if (iVar2 < 1) {
          iVar1 = iVar2;
          if (iVar2 == 0) {
            return 0;
          }
        }
        else {
          local_140 = 4;
          local_160 = self_01;
          nn_ep_getopt(self->ep,0,0xe,&ipv4only_1,&local_140);
          if (local_140 != 4) {
            nn_backtrace_print();
            pcVar3 = "ipv4onlylen == sizeof (ipv4only)";
            uVar6 = 0x160;
            goto LAB_0012edd1;
          }
          iVar1 = nn_iface_resolve(pcVar3,(size_t)(pcVar4 + ~(ulong)pcVar3),ipv4only_1,&local_138,
                                   &local_158);
          self_01 = local_160;
          if (-1 < iVar1) {
            if (local_138.ss_family == 2) {
              sStack_170 = 0x10;
            }
            else {
              if (local_138.ss_family != 10) {
                nn_backtrace_print();
                pcVar3 = "0";
                uVar6 = 0x171;
                goto LAB_0012edd1;
              }
              sStack_170 = 0x1c;
            }
            local_138.__ss_padding._0_2_ = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
            local_158 = sStack_170;
            iVar1 = nn_usock_start(self_00,(uint)local_138.ss_family,1,0);
            if (-1 < iVar1) {
              iVar1 = nn_usock_bind(self_00,(sockaddr *)&local_138,local_158);
              if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
                nn_btcp_start_accepting(self);
                return 0;
              }
              nn_usock_stop(self_00);
            }
          }
        }
      }
      nn_fsm_raise_from_src((nn_fsm *)self,self_01,3,1);
      return iVar1;
    }
  }
  nn_free(self);
  return -0x16;
}

Assistant:

int nn_btcp_create (struct nn_ep *ep)
{
    int rc;
    struct nn_btcp *self;
    const char *addr;
    const char *end;
    const char *pos;
    struct sockaddr_storage ss;
    size_t sslen;
    int ipv4only;
    size_t ipv4onlylen;

    /*  Allocate the new endpoint object. */
    self = nn_alloc (sizeof (struct nn_btcp), "btcp");
    self->ep = ep;
    alloc_assert (self);

    nn_ep_tran_setup (ep, &nn_btcp_ep_ops, self);
    addr = nn_ep_getaddr (ep);

    /*  Parse the port. */
    end = addr + strlen (addr);
    pos = strrchr (addr, ':');
    if (pos == NULL) {
        nn_free (self);
        return -EINVAL;
    }
    ++pos;
    rc = nn_port_resolve (pos, end - pos);
    if (rc < 0) {
        nn_free (self);
        return -EINVAL;
    }

    /*  Check whether IPv6 is to be used. */
    ipv4onlylen = sizeof (ipv4only);
    nn_ep_getopt (ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &ipv4onlylen);
    nn_assert (ipv4onlylen == sizeof (ipv4only));

    /*  Parse the address. */
    rc = nn_iface_resolve (addr, pos - addr - 1, ipv4only, &ss, &sslen);
    if (nn_slow (rc < 0)) {
        nn_free (self);
        return -ENODEV;
    }

    /*  Initialise the structure. */
    nn_fsm_init_root (&self->fsm, nn_btcp_handler, nn_btcp_shutdown,
        nn_ep_getctx (ep));
    nn_fsm_event_init (&self->listen_error);
    self->state = NN_BTCP_STATE_IDLE;
    self->atcp = NULL;
    nn_list_init (&self->atcps);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    nn_usock_init (&self->usock, NN_BTCP_SRC_USOCK, &self->fsm);

    rc = nn_btcp_listen (self);
    if (rc != 0) {
        nn_fsm_raise_from_src (&self->fsm, &self->listen_error,
            NN_BTCP_SRC_BTCP, NN_BTCP_TYPE_LISTEN_ERR);
        return rc;
    }

    return 0;
}